

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFastMap.c
# Opt level: O0

void Ivy_FastMapRequired(Ivy_Man_t *pAig,int Delay,int fSetInter)

{
  Vec_Vec_t *p;
  int iVar1;
  Ivy_Obj_t *pIVar2;
  Vec_Ptr_t *pVVar3;
  Ivy_Supp_t *pIVar4;
  Ivy_Supp_t *pIVar5;
  short local_84;
  int local_4c;
  int local_48;
  int c;
  int k;
  int i;
  Ivy_Supp_t *pSuppF;
  Ivy_Supp_t *pSupp;
  Ivy_Obj_t *pObj;
  Vec_Ptr_t *vNodes;
  Vec_Vec_t *vLuts;
  int fSetInter_local;
  int Delay_local;
  Ivy_Man_t *pAig_local;
  
  for (c = 0; iVar1 = Vec_PtrSize(pAig->vPis), c < iVar1; c = c + 1) {
    pIVar2 = (Ivy_Obj_t *)Vec_PtrEntry(pAig->vPis,c);
    pIVar5 = Ivy_ObjSupp(pAig,pIVar2);
    pIVar5->DelayR = 10000;
    pIVar5->nRefs = 0;
  }
  for (c = 0; iVar1 = Vec_PtrSize(pAig->vObjs), c < iVar1; c = c + 1) {
    pIVar2 = (Ivy_Obj_t *)Vec_PtrEntry(pAig->vObjs,c);
    if ((pIVar2 != (Ivy_Obj_t *)0x0) && (iVar1 = Ivy_ObjIsNode(pIVar2), iVar1 != 0)) {
      pIVar5 = Ivy_ObjSupp(pAig,pIVar2);
      pIVar5->DelayR = 10000;
      pIVar5->nRefs = 0;
    }
  }
  for (c = 0; iVar1 = Vec_PtrSize(pAig->vPos), c < iVar1; c = c + 1) {
    pIVar2 = (Ivy_Obj_t *)Vec_PtrEntry(pAig->vPos,c);
    pIVar2 = Ivy_ObjFanin0(pIVar2);
    pIVar5 = Ivy_ObjSupp(pAig,pIVar2);
    pIVar5->DelayR = (short)Delay;
    pIVar5->nRefs = pIVar5->nRefs + 1;
  }
  p = *(Vec_Vec_t **)((long)pAig->pData + 0x18);
  c = Vec_VecSize(p);
  while (c = c + -1, -1 < c) {
    pVVar3 = Vec_VecEntry(p,c);
    for (local_48 = 0; iVar1 = Vec_PtrSize(pVVar3), local_48 < iVar1; local_48 = local_48 + 1) {
      pIVar2 = (Ivy_Obj_t *)Vec_PtrEntry(pVVar3,local_48);
      pIVar5 = Ivy_ObjSupp(pAig,pIVar2);
      if (pIVar5->nRefs < 1) {
        __assert_fail("pSupp->nRefs > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivyFastMap.c"
                      ,0x366,"void Ivy_FastMapRequired(Ivy_Man_t *, int, int)");
      }
      for (local_4c = 0; local_4c < pIVar5->nSize; local_4c = local_4c + 1) {
        pIVar2 = Ivy_ManObj(pAig,*(int *)(&pIVar5[1].nSize + (long)local_4c * 4));
        pIVar4 = Ivy_ObjSupp(pAig,pIVar2);
        if ((int)pIVar4->DelayR < pIVar5->DelayR + -1) {
          local_84 = pIVar4->DelayR;
        }
        else {
          local_84 = pIVar5->DelayR + -1;
        }
        pIVar4->DelayR = local_84;
        pIVar4->nRefs = pIVar4->nRefs + 1;
      }
    }
  }
  if (fSetInter != 0) {
    c = Vec_VecSize(p);
    while (c = c + -1, -1 < c) {
      pVVar3 = Vec_VecEntry(p,c);
      for (local_48 = 0; iVar1 = Vec_PtrSize(pVVar3), local_48 < iVar1; local_48 = local_48 + 1) {
        pIVar2 = (Ivy_Obj_t *)Vec_PtrEntry(pVVar3,local_48);
        pIVar5 = Ivy_ObjSupp(pAig,pIVar2);
        Ivy_FastMapRequired_rec(pAig,pIVar2,pIVar2,(int)pIVar5->DelayR);
      }
    }
    for (c = 0; iVar1 = Vec_PtrSize(pAig->vObjs), c < iVar1; c = c + 1) {
      pIVar2 = (Ivy_Obj_t *)Vec_PtrEntry(pAig->vObjs,c);
      if (((pIVar2 != (Ivy_Obj_t *)0x0) && (iVar1 = Ivy_ObjIsNode(pIVar2), iVar1 != 0)) &&
         (pIVar5 = Ivy_ObjSupp(pAig,pIVar2), 9999 < pIVar5->DelayR)) {
        __assert_fail("pSupp->DelayR < IVY_INFINITY",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivyFastMap.c"
                      ,0x385,"void Ivy_FastMapRequired(Ivy_Man_t *, int, int)");
      }
    }
  }
  return;
}

Assistant:

void Ivy_FastMapRequired( Ivy_Man_t * pAig, int Delay, int fSetInter )
{
    Vec_Vec_t * vLuts;
    Vec_Ptr_t * vNodes;
    Ivy_Obj_t * pObj;
    Ivy_Supp_t * pSupp, * pSuppF;
    int i, k, c;
    // clean the required times
    Ivy_ManForEachPi( pAig, pObj, i )
    {
        pSupp = Ivy_ObjSupp( pAig, pObj );
        pSupp->DelayR = IVY_INFINITY;
        pSupp->nRefs = 0;
    }
    Ivy_ManForEachNode( pAig, pObj, i )
    {
        pSupp = Ivy_ObjSupp( pAig, pObj );
        pSupp->DelayR = IVY_INFINITY;
        pSupp->nRefs = 0;
    }
    // set the required times of the POs
    Ivy_ManForEachPo( pAig, pObj, i )
    {
        pSupp = Ivy_ObjSupp( pAig, Ivy_ObjFanin0(pObj) );
        pSupp->DelayR = Delay;
        pSupp->nRefs++;
    }
    // get the levelized nodes used in the mapping
    vLuts = ((Ivy_SuppMan_t *)pAig->pData)->vLuts;
    // propagate the required times
    Vec_VecForEachLevelReverse( vLuts, vNodes, i )
    Vec_PtrForEachEntry( Ivy_Obj_t *, vNodes, pObj, k )
    {
        pSupp = Ivy_ObjSupp( pAig, pObj );
        assert( pSupp->nRefs > 0 );
        for ( c = 0; c < pSupp->nSize; c++ )
        {
            pSuppF = Ivy_ObjSupp( pAig, Ivy_ManObj(pAig, pSupp->pArray[c]) );
            pSuppF->DelayR = IVY_MIN( pSuppF->DelayR, pSupp->DelayR - 1 );
            pSuppF->nRefs++;
        }
    }
/*
    // print out some of the required times
    Ivy_ManForEachPi( pAig, pObj, i )
    {
        pSupp = Ivy_ObjSupp( pAig, pObj );
        printf( "%d ", pSupp->DelayR );
    }
    printf( "\n" );    
*/

    if ( fSetInter )
    {
        // set the required times of the intermediate nodes
        Vec_VecForEachLevelReverse( vLuts, vNodes, i )
        Vec_PtrForEachEntry( Ivy_Obj_t *, vNodes, pObj, k )
        {
            pSupp = Ivy_ObjSupp( pAig, pObj );
            Ivy_FastMapRequired_rec( pAig, pObj, pObj, pSupp->DelayR ); 
        }
        // make sure that all required times are assigned
        Ivy_ManForEachNode( pAig, pObj, i )
        {
            pSupp = Ivy_ObjSupp( pAig, pObj );
            assert( pSupp->DelayR < IVY_INFINITY );
        }
    }
}